

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O2

void __thiscall Renderer::setPreviewNote(Renderer *this,int note)

{
  bool bVar1;
  int iVar2;
  int __type;
  Locked<Renderer::RenderContext> ctx;
  
  bVar1 = AudioStream::isEnabled(&this->mStream);
  if (bVar1) {
    Guarded<Renderer::RenderContext>::access
              ((Guarded<Renderer::RenderContext> *)&ctx,(char *)&this->mContext,__type);
    if ((ctx.mRef)->previewState == waveform) {
      iVar2 = trackerboy::lookupToneNote(note);
      trackerboy::DefaultApu::writeRegister(&(ctx.mRef)->apu,'\x1d',(uint8_t)iVar2);
      trackerboy::DefaultApu::writeRegister(&(ctx.mRef)->apu,'\x1e',(uint8_t)((uint)iVar2 >> 8));
    }
    else if ((ctx.mRef)->previewState == instrument) {
      trackerboy::InstrumentPreview::play(&(ctx.mRef)->ip,(uint8_t)note);
    }
    QMutexLocker<QMutex>::unlock(&ctx.super_QMutexLocker<QMutex>);
  }
  return;
}

Assistant:

void Renderer::setPreviewNote(int note) {
    if (mStream.isEnabled()) {
        auto ctx = mContext.access();
        switch (ctx->previewState) {
            case PreviewState::waveform: {
                auto freq = trackerboy::lookupToneNote(note);
                ctx->apu.writeRegister(trackerboy::Apu::REG_NR33, (uint8_t)(freq & 0xFF));
                ctx->apu.writeRegister(trackerboy::Apu::REG_NR34, (uint8_t)(freq >> 8));
                break;
            }
            case PreviewState::instrument:
                // update the current note
                ctx->ip.play((uint8_t)note);
                break;
            default:
                break;
        
        }
    }
}